

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExecuteProcessCommand.cxx
# Opt level: O3

void anon_unknown.dwarf_3ddcd9::cmExecuteProcessCommandFixText
               (vector<char,_std::allocator<char>_> *output,bool strip_trailing_whitespace)

{
  char cVar1;
  uint uVar2;
  int iVar3;
  ulong in_RAX;
  ulong uVar4;
  pointer pcVar5;
  ulong uVar6;
  pointer pcVar7;
  ulong uVar8;
  ulong uVar9;
  undefined8 uStack_28;
  
  pcVar7 = (output->super__Vector_base<char,_std::allocator<char>_>)._M_impl.super__Vector_impl_data
           ._M_start;
  pcVar5 = (output->super__Vector_base<char,_std::allocator<char>_>)._M_impl.super__Vector_impl_data
           ._M_finish;
  uVar6 = (long)pcVar5 - (long)pcVar7;
  uStack_28 = in_RAX;
  if (uVar6 != 0) {
    uVar4 = 0;
    uVar2 = 1;
    uVar8 = 0;
    do {
      cVar1 = pcVar7[uVar4];
      uVar4 = (ulong)uVar2;
      uVar9 = uVar8;
      if ((cVar1 != '\0') && (((cVar1 != '\r' || (uVar6 <= uVar4)) || (pcVar7[uVar4] != '\n')))) {
        uVar9 = (ulong)((int)uVar8 + 1);
        pcVar7[uVar8] = cVar1;
        pcVar7 = (output->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        pcVar5 = (output->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
                 super__Vector_impl_data._M_finish;
      }
      uVar6 = (long)pcVar5 - (long)pcVar7;
      uVar2 = uVar2 + 1;
      uVar8 = uVar9;
    } while (uVar4 < uVar6);
    if (!strip_trailing_whitespace || (int)uVar9 == 0) goto LAB_001c2b1e;
    do {
      cVar1 = pcVar7[uVar9 - 1];
      iVar3 = isspace((int)cVar1);
      if (((iVar3 == 0) && (cVar1 != '\r')) && (cVar1 != '\n')) goto LAB_001c2b1e;
      uVar9 = uVar9 - 1;
    } while (uVar9 != 0);
  }
  uVar9 = 0;
LAB_001c2b1e:
  std::vector<char,_std::allocator<char>_>::resize(output,uVar9 & 0xffffffff);
  uStack_28 = uStack_28 & 0xffffffffffffff;
  std::vector<char,_std::allocator<char>_>::emplace_back<char>
            (output,(char *)((long)&uStack_28 + 7));
  return;
}

Assistant:

void cmExecuteProcessCommandFixText(std::vector<char>& output,
                                    bool strip_trailing_whitespace)
{
  // Remove \0 characters and the \r part of \r\n pairs.
  unsigned int in_index = 0;
  unsigned int out_index = 0;
  while (in_index < output.size()) {
    char c = output[in_index++];
    if ((c != '\r' ||
         !(in_index < output.size() && output[in_index] == '\n')) &&
        c != '\0') {
      output[out_index++] = c;
    }
  }

  // Remove trailing whitespace if requested.
  if (strip_trailing_whitespace) {
    while (out_index > 0 &&
           cmExecuteProcessCommandIsWhitespace(output[out_index - 1])) {
      --out_index;
    }
  }

  // Shrink the vector to the size needed.
  output.resize(out_index);

  // Put a terminator on the text string.
  output.push_back('\0');
}